

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeLocalGet(TranslateToFuzzReader *this,Type type)

{
  Index index_00;
  bool bVar1;
  value_type_conflict3 *pvVar2;
  ulong uVar3;
  Expression *value;
  mapped_type *this_00;
  LocalGet *pLVar4;
  LocalSet *local_68;
  LocalSet *tee;
  Index local_54;
  TranslateToFuzzReader *pTStack_50;
  Index index;
  TranslateToFuzzReader *local_48;
  Index local_3c;
  TranslateToFuzzReader *pTStack_38;
  Index choice;
  TranslateToFuzzReader *local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  mapped_type *locals;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  locals = (mapped_type *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_28 = std::
             unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->funcContext->typeLocals,(key_type *)&this_local);
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(local_28);
  if (bVar1) {
    if (this->trivialNesting == 0) {
      local_3c = upTo(this,3);
      if (local_3c != 0) {
        local_48 = this_local;
        uVar3 = wasm::TypeUpdating::canHandleAsLocal((Type)this_local);
        if ((uVar3 & 1) != 0) {
          local_54 = Builder::addVar(this->funcContext->func,(Type)this_local);
          local_68 = (LocalSet *)0x0;
          if ((local_3c == 1) || (bVar1 = Type::isNonNullable((Type *)&this_local), bVar1)) {
            index_00 = local_54;
            value = make(this,(Type)this_local);
            local_68 = Builder::makeLocalTee(&this->builder,index_00,value,(Type)this_local);
          }
          this_00 = std::
                    unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[](&this->funcContext->typeLocals,(key_type *)&this_local);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_54);
          if (local_68 != (LocalSet *)0x0) {
            return (Expression *)local_68;
          }
          pLVar4 = Builder::makeLocalGet(&this->builder,local_54,(Type)this_local);
          return (Expression *)pLVar4;
        }
      }
      pTStack_50 = this_local;
      type_local.id = (uintptr_t)makeConst(this,(Type)this_local);
    }
    else {
      pTStack_38 = this_local;
      type_local.id = (uintptr_t)makeConst(this,(Type)this_local);
    }
  }
  else {
    pvVar2 = pick<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this,local_28);
    local_30 = this_local;
    type_local.id = (uintptr_t)Builder::makeLocalGet(&this->builder,*pvVar2,(Type)this_local);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeLocalGet(Type type) {
  auto& locals = funcContext->typeLocals[type];
  if (!locals.empty()) {
    return builder.makeLocalGet(pick(locals), type);
  }
  // No existing local. When we want something trivial, just give up and emit a
  // constant.
  if (trivialNesting) {
    return makeConst(type);
  }

  // Otherwise, we have 3 cases: a const, as above (we do this randomly some of
  // the time), or emit a local.get of a new local, or emit a local.tee of a new
  // local.
  auto choice = upTo(3);
  if (choice == 0 || !TypeUpdating::canHandleAsLocal(type)) {
    return makeConst(type);
  }
  // Otherwise, add a new local. If the type is not non-nullable then we may
  // just emit a get for it (which, as this is a brand-new local, will read the
  // default value, unless we are in a loop; for that reason for a non-
  // nullable local we prefer a tee later down.).
  auto index = builder.addVar(funcContext->func, type);
  LocalSet* tee = nullptr;
  if (choice == 1 || type.isNonNullable()) {
    // Create the tee here before adding the local to typeLocals (or else we
    // might end up using it prematurely inside the make() call).
    tee = builder.makeLocalTee(index, make(type), type);
  }
  funcContext->typeLocals[type].push_back(index);
  if (tee) {
    return tee;
  }
  return builder.makeLocalGet(index, type);
}